

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::
MessageVisitor<should_convert_from_ref::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>::
callVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)75>,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>
          (MessageVisitor<should_convert_from_ref::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
           *this,void *header,undefined8 *message)

{
  Visitor *this_00;
  long lVar1;
  undefined8 *puVar2;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  *pVVar3;
  byte bVar4;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  local_430;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  local_198;
  
  bVar4 = 0;
  this_00 = *(Visitor **)(this + 8);
  memcpy(&local_430,header,400);
  llvm::
  SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_10U>
  ::SmallVector(&local_430.
                 super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                 .
                 super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                 .unparsed,
                (SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_10U>
                 *)((long)header + 400));
  puVar2 = message;
  pVVar3 = &local_198;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)
     &(pVVar3->
      super_MessageRef<Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      ).
      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_false>.value =
         *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pVVar3 = (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
              *)((long)pVVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  llvm::
  SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
  ::SmallVector(&local_198.
                 super_MessageRef<Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                 .
                 super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                 .unparsed,
                (SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
                 *)(message + 0xc));
  should_convert_from_ref::Visitor::operator()(this_00,&local_430,&local_198);
  if ((U *)local_198.
           super_MessageRef<Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
           .
           super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
           .unparsed.
           super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
           .
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           .
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           .super_SmallVectorBase.BeginX !=
      (U *)((long)&local_198.
                   super_MessageRef<Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                   .
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                   .unparsed.
                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                   .
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           + 0x18U)) {
    free(local_198.
         super_MessageRef<Fixpp::Chars<_K_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
         .
         super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
         .unparsed.
         super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
         .
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
         .
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
         .super_SmallVectorBase.BeginX);
  }
  if ((U *)local_430.
           super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
           .
           super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
           .unparsed.
           super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
           .
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
           .
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
           .super_SmallVectorBase.BeginX !=
      (U *)((long)&local_430.
                   super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                   .
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                   .unparsed.
                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
                   .
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
           + 0x18U)) {
    free(local_430.
         super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
         .
         super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
         .unparsed.
         super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
         .
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
         .
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
         .super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void callVisitor(const Header& header, const Message& message, std::true_type /* is_void */)
            {
                visitor(header, message);
            }